

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

RecyclableObject *
Js::JavascriptArray::ArraySpeciesCreate<unsigned_int>
          (Var originalArray,uint length,ScriptContext *scriptContext,bool *pIsIntArray,
          bool *pIsFloatArray,bool *pIsBuiltinArrayCtor)

{
  JavascriptLibrary *this;
  DynamicTypeHandler *typeHandler;
  ScriptContext *pSVar1;
  code *pcVar2;
  anon_class_40_5_c40fc4e1 implicitCall;
  CallInfo CVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  DynamicObject *pDVar7;
  PathTypeHandlerBase *pPVar8;
  RecyclableObject *pRVar9;
  undefined4 *puVar10;
  Var aValue;
  JavascriptArray *pJVar11;
  RuntimeFunction *local_c8;
  Var constructorArgs [2];
  ScriptContext *local_88;
  ScriptContext *scriptContext_local;
  CallInfo constructorCallInfo;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  RuntimeFunction *local_38;
  Var constructor;
  
  if (originalArray == (Var)0x0) {
    return (RecyclableObject *)0x0;
  }
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  local_88 = scriptContext;
  constructorCallInfo = (CallInfo)pIsFloatArray;
  jsReentLock._28_4_ = length;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,originalArray);
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  bVar4 = IsNonES5Array(originalArray);
  if (bVar4) {
    pDVar7 = UnsafeVarTo<Js::DynamicObject>(originalArray);
    typeHandler = *(DynamicTypeHandler **)((pDVar7->super_RecyclableObject).type.ptr + 1);
    iVar5 = (*typeHandler->_vptr_DynamicTypeHandler[0x4e])(typeHandler);
    if ((((iVar5 == 0) ||
         (pPVar8 = PathTypeHandlerBase::FromTypeHandler(typeHandler),
         pPVar8->hasUserDefinedCtor != false)) ||
        (pDVar7 = (DynamicObject *)RecyclableObject::GetPrototype(&pDVar7->super_RecyclableObject),
        pDVar7 != (this->super_JavascriptLibraryBase).arrayPrototype.ptr)) ||
       (this->arrayObjectHasUserDefinedSpecies != false)) goto LAB_00a5f122;
LAB_00a5f3e2:
    pJVar11 = (JavascriptArray *)0x0;
  }
  else {
LAB_00a5f122:
    local_38 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    bVar4 = JavascriptOperators::IsArray(originalArray);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (bVar4) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(originalArray);
      BVar6 = JavascriptOperators::GetProperty
                        (pRVar9,0x67,&local_38,scriptContext,(PropertyValueInfo *)0x0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      if (BVar6 == 0) goto LAB_00a5f3e2;
      bVar4 = JavascriptOperators::IsConstructor(local_38);
      if (bVar4) {
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>(local_38);
        pSVar1 = (((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if ((pSVar1 != scriptContext) &&
           ((((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            arrayConstructor.ptr == local_38)) {
          local_38 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
        }
      }
      BVar6 = JavascriptOperators::IsObject(local_38);
      if (BVar6 != 0) {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar6 = JavascriptOperators::GetProperty
                          ((RecyclableObject *)local_38,0x19,&local_38,scriptContext,
                           (PropertyValueInfo *)0x0);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (BVar6 == 0) {
          if (pIsBuiltinArrayCtor != (bool *)0x0) {
            *pIsBuiltinArrayCtor = false;
          }
          goto LAB_00a5f3e2;
        }
        if (local_38 == (RuntimeFunction *)(this->super_JavascriptLibraryBase).nullValue.ptr) {
          local_38 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
        }
      }
    }
    if ((local_38 == (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr) ||
       (local_38 == (this->super_JavascriptLibraryBase).arrayConstructor.ptr)) {
      if (pIsIntArray == (bool *)0x0) {
        pJVar11 = JavascriptLibrary::CreateArray(this,jsReentLock._28_4_);
      }
      else {
        pJVar11 = VarTo<Js::JavascriptArray>(originalArray);
        CVar3 = constructorCallInfo;
        GetArrayTypeAndConvert(pJVar11,pIsIntArray,(bool *)constructorCallInfo);
        pJVar11 = CreateNewArrayHelper
                            (jsReentLock._28_4_,*pIsIntArray,*(bool *)CVar3,pJVar11,scriptContext);
      }
    }
    else {
      bVar4 = JavascriptOperators::IsConstructor(local_38);
      if (!bVar4) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec00,L"constructor[Symbol.species]");
      }
      if (pIsBuiltinArrayCtor != (bool *)0x0) {
        *pIsBuiltinArrayCtor = false;
      }
      local_c8 = local_38;
      constructorArgs[0] = JavascriptNumber::ToVar(jsReentLock._28_4_,scriptContext);
      scriptContext_local = (ScriptContext *)0x1000002;
      bVar4 = VarIs<Js::RecyclableObject>(local_38);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x30a7,"(Js::VarIs<Js::RecyclableObject>(constructor))",
                                    "Js::VarIs<Js::RecyclableObject>(constructor)");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar10 = 0;
      }
      implicitCall.constructor = &local_38;
      implicitCall.jsReentLock = (JsReentLock *)local_60;
      implicitCall.constructorCallInfo = (CallInfo *)&scriptContext_local;
      implicitCall.constructorArgs = (Var (*) [2])&local_c8;
      implicitCall.scriptContext = &local_88;
      aValue = ThreadContext::
               ExecuteImplicitCall<Js::JavascriptArray::ArraySpeciesCreate<unsigned_int>(void*,unsigned_int,Js::ScriptContext*,bool*,bool*,bool*)::_lambda()_1_>
                         (scriptContext->threadContext,(RecyclableObject *)local_38,
                          ImplicitCall_Accessor,implicitCall);
      pJVar11 = (JavascriptArray *)VarTo<Js::RecyclableObject>(aValue);
    }
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)pJVar11;
}

Assistant:

RecyclableObject*
    JavascriptArray::ArraySpeciesCreate(Var originalArray, T length, ScriptContext* scriptContext, bool *pIsIntArray, bool *pIsFloatArray, bool *pIsBuiltinArrayCtor)
    {
        if (originalArray == nullptr)
        {
            return nullptr;
        }

        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, originalArray);

        auto* library = scriptContext->GetLibrary();

        if (JavascriptArray::IsNonES5Array(originalArray))
        {
            auto* dynamicObject = UnsafeVarTo<DynamicObject>(originalArray);
            auto* typeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();

            if (typeHandler->IsPathTypeHandler()
                && !PathTypeHandlerBase::FromTypeHandler(typeHandler)->HasUserDefinedCtor()
                && dynamicObject->GetPrototype() == library->GetArrayPrototype()
                && !library->GetArrayObjectHasUserDefinedSpecies())
            {
                return nullptr;
            }
        }

        Var constructor = library->GetUndefined();

        JS_REENTRANT(jsReentLock, BOOL isArray = JavascriptOperators::IsArray(originalArray));
        if (isArray)
        {
            JS_REENTRANT(jsReentLock, BOOL getProp = JavascriptOperators::GetProperty(UnsafeVarTo<RecyclableObject>(originalArray), PropertyIds::constructor, &constructor, scriptContext));
            if (!getProp)
            {
                return nullptr;
            }

            if (JavascriptOperators::IsConstructor(constructor))
            {
                ScriptContext* constructorScriptContext = UnsafeVarTo<RecyclableObject>(constructor)->GetScriptContext();
                if (constructorScriptContext != scriptContext)
                {
                    if (constructorScriptContext->GetLibrary()->GetArrayConstructor() == constructor)
                    {
                        constructor = library->GetUndefined();
                    }
                }
            }

            if (JavascriptOperators::IsObject(constructor))
            {
                JS_REENTRANT(jsReentLock, getProp = JavascriptOperators::GetProperty((RecyclableObject*)constructor, PropertyIds::_symbolSpecies, &constructor, scriptContext));
                if (!getProp)
                {
                    if (pIsBuiltinArrayCtor != nullptr)
                    {
                        *pIsBuiltinArrayCtor = false;
                    }
                    return nullptr;
                }
                if (constructor == library->GetNull())
                {
                    constructor = library->GetUndefined();
                }
            }
        }

        if (constructor == library->GetUndefined() || constructor == library->GetArrayConstructor())
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }

            if (nullptr == pIsIntArray)
            {
                return library->CreateArray(static_cast<uint32>(length));
            }
            else
            {
                // If the constructor function is the built-in Array constructor, we can be smart and create the right type of native array.
                JavascriptArray* pArr = VarTo<JavascriptArray>(originalArray);
                pArr->GetArrayTypeAndConvert(pIsIntArray, pIsFloatArray);
                return CreateNewArrayHelper(static_cast<uint32>(length), *pIsIntArray, *pIsFloatArray, pArr, scriptContext);
            }
        }

        if (!JavascriptOperators::IsConstructor(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor, _u("constructor[Symbol.species]"));
        }

        if (pIsBuiltinArrayCtor != nullptr)
        {
            *pIsBuiltinArrayCtor = false;
        }

        Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(length, scriptContext) };
        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));

        AssertOrFailFast(Js::VarIs<Js::RecyclableObject>(constructor));
        ThreadContext* threadContext = scriptContext->GetThreadContext();
        Var scObject = threadContext->ExecuteImplicitCall((RecyclableObject*)constructor, ImplicitCall_Accessor, [&]()->Js::Var
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext));
        });
        return VarTo<RecyclableObject>(scObject);
    }